

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O3

void __thiscall
Assimp::X3DImporter::XML_ReadNode_GetAttrVal_AsListCol3f
          (X3DImporter *this,int pAttrIdx,list<aiColor3D,_std::allocator<aiColor3D>_> *pValue)

{
  size_t *psVar1;
  FIReader *pFVar2;
  int iVar3;
  _List_node_base *p_Var4;
  undefined4 extraout_var;
  undefined8 extraout_RAX;
  pointer pfVar5;
  vector<float,_std::allocator<float>_> tlist;
  allocator local_7d;
  float local_7c;
  vector<float,_std::allocator<float>_> local_78;
  _List_node_base *local_58;
  undefined8 uStack_50;
  string local_40;
  
  local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  XML_ReadNode_GetAttrVal_AsArrF(this,pAttrIdx,&local_78);
  if (0x5555555555555555 <
      (ulong)(((long)local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2) * -0x5555555555555555)) {
    pFVar2 = (this->mReader)._M_t.
             super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
             super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
             super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
    iVar3 = (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                      (pFVar2,pAttrIdx);
    std::__cxx11::string::string((string *)&local_40,(char *)CONCAT44(extraout_var,iVar3),&local_7d)
    ;
    Throw_ConvertFail_Str2ArrF(this,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    if (local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    _Unwind_Resume(extraout_RAX);
  }
  pfVar5 = local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    do {
      local_58 = *(_List_node_base **)pfVar5;
      uStack_50 = 0;
      local_7c = pfVar5[2];
      p_Var4 = (_List_node_base *)operator_new(0x20);
      p_Var4[1]._M_next = local_58;
      *(float *)&p_Var4[1]._M_prev = local_7c;
      std::__detail::_List_node_base::_M_hook(p_Var4);
      psVar1 = &(pValue->super__List_base<aiColor3D,_std::allocator<aiColor3D>_>)._M_impl._M_node.
                _M_size;
      *psVar1 = *psVar1 + 1;
      pfVar5 = pfVar5 + 3;
    } while (pfVar5 != local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  if (local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void X3DImporter::XML_ReadNode_GetAttrVal_AsListCol3f(const int pAttrIdx, std::list<aiColor3D>& pValue)
{
    std::vector<float> tlist;

	XML_ReadNode_GetAttrVal_AsArrF(pAttrIdx, tlist);// read as list
	if(tlist.size() % 3) Throw_ConvertFail_Str2ArrF(mReader->getAttributeValue(pAttrIdx));

	// copy data to array
	for(std::vector<float>::iterator it = tlist.begin(); it != tlist.end();)
	{
		aiColor3D tcol;

		tcol.r = *it++;
		tcol.g = *it++;
		tcol.b = *it++;
		pValue.push_back(tcol);
	}
}